

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

double dlib::string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  int iVar1;
  string_cast_error *psVar2;
  double temp;
  string local_1b8;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> sin;
  byte abStack_178 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&sin,(string *)str,_S_in);
  std::istream::_M_extract<double>((double *)&sin);
  if ((abStack_178[*(long *)(_sin + -0x18)] & 5) != 0) {
    psVar2 = (string_cast_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_1b8,(string *)str);
    string_cast_error::string_cast_error(psVar2,&local_1b8);
    __cxa_throw(psVar2,&string_cast_error::typeinfo,error::~error);
  }
  iVar1 = std::istream::get();
  if (iVar1 == -1) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&sin);
    return temp;
  }
  psVar2 = (string_cast_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_1b8,(string *)str);
  string_cast_error::string_cast_error(psVar2,&local_1b8);
  __cxa_throw(psVar2,&string_cast_error::typeinfo,error::~error);
}

Assistant:

static const T cast (
            const std::basic_string<charT,traits,alloc>& str
        )
        {
            using namespace std;
            basic_istringstream<charT,traits,alloc> sin(str);
            T temp;
            sin >> temp;
            if (!sin) throw string_cast_error(narrow(str));
            if (sin.get() != std::char_traits<charT>::eof()) throw string_cast_error(narrow(str));   
            return temp;
        }